

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

bool tinyusdz::is_identity(matrix2f *m)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  
  fVar1 = m->m[0][0];
  if (-1 < (int)fVar1) {
    uVar3 = (int)fVar1 + 0xc0800000;
    uVar4 = -uVar3;
    if (0 < (int)uVar3) {
      uVar4 = uVar3;
    }
    if (uVar4 < 2) {
      fVar1 = m->m[0][1];
      bVar2 = (uint)fVar1 < 2;
      if ((int)fVar1 < 0) {
        bVar2 = ABS(fVar1) == 0.0;
      }
      if (bVar2) {
        fVar1 = m->m[1][0];
        bVar2 = (uint)fVar1 < 2;
        if ((int)fVar1 < 0) {
          bVar2 = ABS(fVar1) == 0.0;
        }
        if (bVar2) {
          fVar1 = m->m[1][1];
          if (-1 < (int)fVar1) {
            return (uint)fVar1 < 2;
          }
          return ABS(fVar1) == 0.0;
        }
      }
    }
  }
  return false;
}

Assistant:

bool is_identity(const value::matrix2f &m) {
  return math::almost_equals_by_ulps(m.m[0][0], 1.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[0][1], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[1][0], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[1][1], 0.0f, kIdentityMaxUlps);
}